

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_choice.cpp
# Opt level: O1

void Am_Choice_Abort_Do_proc(Am_Object *inter)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object obj;
  Am_Object local_10;
  
  local_10.data = (Am_Object_Data *)0x0;
  pAVar2 = Am_Object::Get(inter,0x16b,0);
  Am_Object::operator=(&local_10,pAVar2);
  pAVar2 = Am_Object::Get(inter,0xdd,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
  if (bVar1) {
    bVar1 = Am_Object::Valid(&local_10);
    if (bVar1) {
      Am_Object::Set(&local_10,0x173,false,1);
    }
    pAVar2 = Am_Object::Get(inter,0x16a,0);
    Am_Object::operator=(&local_10,pAVar2);
    bVar1 = Am_Object::Valid(&local_10);
    if (bVar1) {
      Am_Object::Set(&local_10,0x173,false,1);
    }
  }
  Am_Object::~Am_Object(&local_10);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Choice_Abort_Do, (Am_Object inter))
{
  Am_Object obj;
  obj = inter.Get(Am_OLD_INTERIM_VALUE);
  bool set_selected = inter.Get(Am_SET_SELECTED);
  if (set_selected) {
    if (obj.Valid()) {
      Am_REPORT_SET_SEL_VALUE(false, inter, obj, false);
      obj.Set(Am_INTERIM_SELECTED, false, Am_OK_IF_NOT_THERE);
    }
    obj = inter.Get(Am_INTERIM_VALUE);
    if (obj.Valid()) {
      Am_REPORT_SET_SEL_VALUE(false, inter, obj, false);
      obj.Set(Am_INTERIM_SELECTED, false, Am_OK_IF_NOT_THERE);
    }
  }
}